

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_add_array_item(AMQP_VALUE value,AMQP_VALUE array_item_value)

{
  undefined1 auVar1 [16];
  LOGGER_LOG p_Var2;
  AMQP_VALUE value_00;
  void *pvVar3;
  size_t local_88;
  size_t local_80;
  ulong local_78;
  LOGGER_LOG l_4;
  size_t realloc_size;
  AMQP_VALUE *new_array;
  LOGGER_LOG l_3;
  AMQP_VALUE cloned_item;
  LOGGER_LOG l_2;
  AMQP_VALUE_DATA *array_item_value_data;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE array_item_value_local;
  AMQP_VALUE value_local;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_add_array_item",0x765,1,"NULL value");
    }
    l._4_4_ = 0x766;
  }
  else if (value->type == AMQP_TYPE_ARRAY) {
    if (((value->value).binary_value.length == 0) ||
       (array_item_value->type == (*(value->value).list_value.items)->type)) {
      value_00 = amqpvalue_clone(array_item_value);
      if (value_00 == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_add_array_item",0x783,1,"Cannot clone value to put in the array");
        }
        l._4_4_ = 0x784;
      }
      else {
        if ((ulong)(value->value).binary_value.length < 0xfffffffffffffffe) {
          local_78 = (ulong)(value->value).binary_value.length + 1;
        }
        else {
          local_78 = 0xffffffffffffffff;
        }
        if (local_78 == 0) {
          local_80 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_78;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
            local_88 = 0xffffffffffffffff;
          }
          else {
            local_88 = local_78 << 3;
          }
          local_80 = local_88;
        }
        if ((local_80 == 0xffffffffffffffff) ||
           (pvVar3 = realloc((value->value).binary_value.bytes,local_80), pvVar3 == (void *)0x0)) {
          amqpvalue_destroy(value_00);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                      ,"amqpvalue_add_array_item",0x791,1,"Cannot resize array, size:%zu",local_80);
          }
          l._4_4_ = 0x792;
        }
        else {
          (value->value).binary_value.bytes = pvVar3;
          *(AMQP_VALUE *)
           (&((value->value).described_value.descriptor)->type +
           (ulong)(value->value).binary_value.length * 2) = value_00;
          (value->value).binary_value.length = (value->value).binary_value.length + 1;
          l._4_4_ = 0;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_add_array_item",0x778,1,"Cannot put different types in the same array"
                 );
      }
      l._4_4_ = 0x779;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_add_array_item",0x76e,1,"Value is not of type ARRAY");
    }
    l._4_4_ = 0x76f;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_add_array_item(AMQP_VALUE value, AMQP_VALUE array_item_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_409: [ If `value` or `array_item_value` is NULL, amqpvalue_add_array_item shall fail and return a non-zero value. ]*/
    if (value == NULL)
    {
        LogError("NULL value");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_413: [ If the `value` argument is not an AMQP array created with the `amqpvalue_create_array` function than `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_ARRAY)
        {
            LogError("Value is not of type ARRAY");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_425: [ If the type of `array_item_value` does not match that of items already in the array then `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
            AMQP_VALUE_DATA* array_item_value_data = (AMQP_VALUE_DATA*)array_item_value;
            if ((value_data->value.array_value.count > 0) &&
                (array_item_value_data->type != value_data->value.array_value.items[0]->type))
            {
                LogError("Cannot put different types in the same array");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_410: [ The item stored at the n-th position in the array shall be a clone of `array_item_value`. ] */
                AMQP_VALUE cloned_item = amqpvalue_clone(array_item_value);
                if (cloned_item == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_423: [ When `amqpvalue_add_array_item` fails due to not being able to clone the item or grow the array, the array shall not be altered. ] */
                    /* Codes_SRS_AMQPVALUE_01_412: [ If cloning the item fails, `amqpvalue_add_array_item` shall fail and return a non-zero value. ]*/
                    LogError("Cannot clone value to put in the array");
                    result = MU_FAILURE;
                }
                else
                {
                    AMQP_VALUE* new_array;
                    size_t realloc_size = safe_add_size_t((size_t)value_data->value.array_value.count, 1);
                    realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_VALUE));
                    if (realloc_size == SIZE_MAX ||
                        (new_array = (AMQP_VALUE*)realloc(value_data->value.array_value.items, realloc_size)) == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_423: [ When `amqpvalue_add_array_item` fails due to not being able to clone the item or grow the array, the array shall not be altered. ] */
                        /* Codes_SRS_AMQPVALUE_01_424: [ If growing the array fails, then `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
                        amqpvalue_destroy(cloned_item);
                        LogError("Cannot resize array, size:%zu", realloc_size);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        value_data->value.array_value.items = new_array;

                        /* Codes_SRS_AMQPVALUE_01_407: [ `amqpvalue_add_array_item` shall add the AMQP_VALUE specified by `array_item_value` at the 0 based n-th position in the array. ]*/
                        value_data->value.array_value.items[value_data->value.array_value.count] = cloned_item;
                        value_data->value.array_value.count++;

                        /* Codes_SRS_AMQPVALUE_01_408: [ On success `amqpvalue_add_array_item` shall return 0. ]*/
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}